

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void on_read_connection(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 local_30 [16];
  
  if (nread != 0) {
    if (-1 < nread) {
      fprintf(_stderr,"got %d bytes\n",nread & 0xffffffff);
      iVar2 = uv_pipe_pending_count(handle);
      if (iVar2 == 1) {
        iVar2 = uv_pipe_pending_type(handle);
        auVar1._8_8_ = local_30._8_8_;
        auVar1._0_8_ = local_30._0_8_;
        if ((buf->base == (char *)0x0) || (iVar2 == 0)) {
          pcVar4 = "nread > 0 && buf->base && pending != UV_UNKNOWN_HANDLE";
          uVar3 = 0x184;
        }
        else {
          read_cb_called = read_cb_called + 1;
          if (iVar2 == 0xc) {
            uVar3 = uv_default_loop();
            iVar2 = uv_tcp_init(uVar3,&tcp_connection);
            if (iVar2 == 0) {
              iVar2 = uv_accept(handle,&tcp_connection);
              if (iVar2 == 0) {
                iVar2 = bcmp("hello\n",buf->base,nread);
                if (iVar2 == 0) {
                  local_30 = uv_buf_init("world\n",6);
                  iVar2 = uv_write(&write_req,&tcp_connection,local_30,1,on_tcp_write);
                  if (iVar2 == 0) {
                    iVar2 = uv_read_start(&tcp_connection,on_read_alloc,on_tcp_read);
                    if (iVar2 == 0) {
                      free(buf->base);
                      return;
                    }
                    pcVar4 = "r == 0";
                    uVar3 = 0x199;
                  }
                  else {
                    pcVar4 = "r == 0";
                    uVar3 = 0x196;
                  }
                }
                else {
                  pcVar4 = "memcmp(\"hello\\n\", buf->base, nread) == 0";
                  uVar3 = 400;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0x18d;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x18a;
            }
          }
          else {
            pcVar4 = "pending == UV_TCP";
            uVar3 = 0x188;
            local_30 = auVar1;
          }
        }
      }
      else {
        pcVar4 = "1 == uv_pipe_pending_count(pipe)";
        uVar3 = 0x181;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,uVar3,pcVar4);
      abort();
    }
    if (nread != -0xfff) {
      uVar3 = uv_strerror(nread & 0xffffffff);
      printf("error recving on channel: %s\n",uVar3);
      abort();
    }
  }
  free(buf->base);
  return;
}

Assistant:

static void on_read_connection(uv_stream_t* handle,
                               ssize_t nread,
                               const uv_buf_t* buf) {
  int r;
  uv_buf_t outbuf;
  uv_pipe_t* pipe;
  uv_handle_type pending;

  pipe = (uv_pipe_t*) handle;
  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  fprintf(stderr, "got %d bytes\n", (int)nread);

  ASSERT(1 == uv_pipe_pending_count(pipe));
  pending = uv_pipe_pending_type(pipe);

  ASSERT(nread > 0 && buf->base && pending != UV_UNKNOWN_HANDLE);
  read_cb_called++;

  /* Accept the pending TCP connection */
  ASSERT(pending == UV_TCP);
  r = uv_tcp_init(uv_default_loop(), &tcp_connection);
  ASSERT(r == 0);

  r = uv_accept(handle, (uv_stream_t*)&tcp_connection);
  ASSERT(r == 0);

  /* Make sure that the expected data is correctly multiplexed. */
  ASSERT(memcmp("hello\n", buf->base, nread) == 0);

  /* Write/read to/from the connection */
  outbuf = uv_buf_init("world\n", 6);
  r = uv_write(&write_req, (uv_stream_t*)&tcp_connection, &outbuf, 1,
    on_tcp_write);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&tcp_connection, on_read_alloc, on_tcp_read);
  ASSERT(r == 0);

  free(buf->base);
}